

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

int wally_psbt_finalize(wally_psbt *psbt)

{
  wally_psbt_input *input;
  wally_psbt_input *pwVar1;
  wally_tx_output *pwVar2;
  wally_tx *pwVar3;
  wally_map_item *pwVar4;
  bool bVar5;
  wally_map *pwVar6;
  _Bool _Var7;
  int iVar8;
  char cVar9;
  uchar *bytes;
  size_t in_RSI;
  size_t sVar10;
  uchar *puVar11;
  ulong uVar12;
  ulong uVar13;
  size_t local_4a8;
  uchar *local_498;
  size_t opcode_size;
  size_t threshold;
  size_t n_pubkeys;
  wally_map *local_470;
  uchar *local_468;
  wally_tx_witness_stack **local_460;
  uchar *local_458;
  size_t type;
  size_t sig_index;
  size_t found_pubkey_len;
  uint32_t sighashes [15];
  uchar script [140];
  
  iVar8 = -2;
  if (((psbt != (wally_psbt *)0x0) && (iVar8 = -2, psbt->tx != (wally_tx *)0x0)) &&
     (psbt->tx->num_inputs == psbt->num_inputs)) {
    if (psbt->num_inputs != 0) {
      uVar13 = 0;
      do {
        pwVar1 = psbt->inputs;
        if ((pwVar1[uVar13].final_scriptsig == (uchar *)0x0) &&
           (input = pwVar1 + uVar13, input->final_witness == (wally_tx_witness_stack *)0x0)) {
          uVar12 = (ulong)psbt->tx->inputs[uVar13].index;
          pwVar2 = input->witness_utxo;
          if ((pwVar2 == (wally_tx_output *)0x0) || (pwVar2->script_len == 0)) {
            pwVar3 = input->utxo;
            if ((pwVar3 == (wally_tx *)0x0) || (pwVar3->num_outputs <= uVar12)) {
              bytes = (uchar *)0x0;
            }
            else {
              bytes = pwVar3->outputs[uVar12].script;
              in_RSI = pwVar3->outputs[uVar12].script_len;
            }
            bVar5 = false;
          }
          else {
            bytes = pwVar2->script;
            bVar5 = true;
            in_RSI = pwVar2->script_len;
          }
          local_458 = input->redeem_script;
          if (local_458 != (uchar *)0x0) {
            in_RSI = input->redeem_script_len;
            bytes = local_458;
          }
          if (input->witness_script != (uchar *)0x0) {
            in_RSI = input->witness_script_len;
            bVar5 = true;
            bytes = input->witness_script;
          }
          if ((bytes != (uchar *)0x0) &&
             (iVar8 = wally_scriptpubkey_get_type(bytes,in_RSI,&type), iVar8 == 0)) {
            if (type == 0x20) {
              uVar12 = 0;
              local_460 = &input->final_witness;
              _Var7 = script_is_op_n(*bytes,false,&threshold);
              if (_Var7) {
                if (threshold <= (input->signatures).num_items) {
                  puVar11 = bytes + in_RSI;
                  uVar12 = 0;
                  _Var7 = script_is_op_n(puVar11[-2],false,&n_pubkeys);
                  if (0xf < n_pubkeys || !_Var7) goto LAB_004b8f09;
                  if (n_pubkeys == 0) {
                    local_4a8 = 0;
                  }
                  else {
                    local_498 = bytes + 1;
                    local_4a8 = 0;
                    if (local_498 < puVar11) {
                      local_470 = &input->signatures;
                      uVar12 = 1;
                      local_4a8 = 0;
                      local_468 = puVar11;
                      do {
                        sVar10 = (long)local_468 - (long)local_498;
                        iVar8 = script_get_push_size_from_bytes(local_498,sVar10,&found_pubkey_len);
                        cVar9 = '\x02';
                        if (iVar8 == 0) {
                          iVar8 = script_get_push_opcode_size_from_bytes
                                            (local_498,sVar10,&opcode_size);
                          pwVar6 = local_470;
                          if (iVar8 == 0) {
                            puVar11 = local_498 + opcode_size;
                            local_498 = puVar11 + found_pubkey_len;
                            iVar8 = wally_map_find(local_470,puVar11,found_pubkey_len,&sig_index);
                            cVar9 = '\x05';
                            if (sig_index != 0 && iVar8 == 0) {
                              puVar11 = pwVar6->items[sig_index - 1].value;
                              sVar10 = pwVar6->items[sig_index - 1].value_len;
                              sighashes[local_4a8] = (uint)puVar11[sVar10 - 1];
                              iVar8 = wally_ec_sig_from_der
                                                (puVar11,sVar10 - 1,script + local_4a8 * 0x40,0x40);
                              if (iVar8 == 0) {
                                local_4a8 = local_4a8 + 1;
                                cVar9 = (local_4a8 == threshold) * '\x03';
                              }
                              else {
                                cVar9 = '\x05';
                              }
                            }
                          }
                          else {
                            cVar9 = '\x02';
                          }
                        }
                        switch(cVar9) {
                        case '\0':
                        case '\x05':
                          if ((n_pubkeys <= uVar12) || (uVar12 = uVar12 + 1, local_468 <= local_498)
                             ) goto switchD_004b8d34_caseD_3;
                          break;
                        default:
                          goto LAB_004b8f28;
                        case '\x02':
                          goto switchD_004b8d34_caseD_2;
                        case '\x03':
                          goto switchD_004b8d34_caseD_3;
                        }
                      } while( true );
                    }
                  }
switchD_004b8d34_caseD_3:
                  if (local_4a8 == threshold) {
                    if (bVar5) {
                      iVar8 = wally_witness_multisig_from_bytes
                                        (bytes,in_RSI,script,local_4a8 << 6,sighashes,local_4a8,0,
                                         local_460);
                      if ((iVar8 == 0) &&
                         ((local_458 == (uchar *)0x0 ||
                          (_Var7 = finalize_p2sh_wrapped(input), _Var7)))) {
LAB_004b8f06:
                        uVar12 = 1;
                        goto LAB_004b8f09;
                      }
                    }
                    else {
                      sVar10 = local_4a8 * 0x4a + in_RSI;
                      puVar11 = (uchar *)wally_malloc(sVar10);
                      if ((puVar11 != (uchar *)0x0) &&
                         (iVar8 = wally_scriptsig_multisig_from_bytes
                                            (bytes,in_RSI,script,local_4a8 << 6,sighashes,local_4a8,
                                             0,puVar11,sVar10,&opcode_size), iVar8 == 0)) {
                        input->final_scriptsig = puVar11;
                        input->final_scriptsig_len = opcode_size;
                        goto LAB_004b8f06;
                      }
                      wally_free(puVar11);
                    }
                  }
                }
switchD_004b8d34_caseD_2:
                uVar12 = 0;
              }
LAB_004b8f09:
              wally_clear_2(script,0x3c0,sighashes,0x3c);
LAB_004b8f28:
              if ((uVar12 & 1) != 0) {
LAB_004b8f32:
                clear_and_free(input->redeem_script,input->redeem_script_len);
                input->redeem_script = (uchar *)0x0;
                input->redeem_script_len = 0;
                clear_and_free(input->witness_script,input->witness_script_len);
                input->witness_script = (uchar *)0x0;
                input->witness_script_len = 0;
                wally_map_clear(&input->keypaths);
                wally_map_clear(&input->signatures);
                input->sighash = 0;
              }
            }
            else if (type == 8) {
              if ((input->signatures).num_items == 1) {
                pwVar4 = (input->signatures).items;
                iVar8 = wally_witness_p2wpkh_from_der
                                  (pwVar4->key,pwVar4->key_len,pwVar4->value,pwVar4->value_len,
                                   &input->final_witness);
                if ((iVar8 == 0) &&
                   ((input->redeem_script == (uchar *)0x0 ||
                    (_Var7 = finalize_p2sh_wrapped(input), _Var7)))) goto LAB_004b8f32;
              }
            }
            else if ((type == 2) && ((input->signatures).num_items == 1)) {
              pwVar4 = (input->signatures).items;
              iVar8 = wally_scriptsig_p2pkh_from_der
                                (pwVar4->key,pwVar4->key_len,pwVar4->value,pwVar4->value_len,script,
                                 0x8c,(size_t *)sighashes);
              if ((iVar8 == 0) &&
                 (_Var7 = clone_bytes(&pwVar1[uVar13].final_scriptsig,script,sighashes._0_8_), _Var7
                 )) {
                input->final_scriptsig_len = sighashes._0_8_;
                goto LAB_004b8f32;
              }
            }
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < psbt->num_inputs);
    }
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int wally_psbt_finalize(struct wally_psbt *psbt)
{
    size_t i;

    if (!psbt || !psbt->tx || psbt->tx->num_inputs != psbt->num_inputs)
        return WALLY_EINVAL;

    for (i = 0; i < psbt->num_inputs; ++i) {
        struct wally_psbt_input *input = &psbt->inputs[i];
        const uint32_t utxo_index = psbt->tx->inputs[i].index;

        /* Script for this input. originally set to the input's scriptPubKey, but in the case of a p2sh/p2wsh
         * input, it will be eventually be set to the unhashed script, if known */
        unsigned char *out_script = NULL;
        size_t out_script_len, type;
        bool is_witness = false, is_p2sh = false;

        if (input->final_scriptsig || input->final_witness)
            continue; /* Already finalized */

        /* Note that if we patch libwally to supply the non-witness utxo tx field (tx) for
        * witness inputs also, we'll need a different way to signal p2sh-p2wpkh scripts */
        if (input->witness_utxo && input->witness_utxo->script_len > 0) {
            out_script = input->witness_utxo->script;
            out_script_len = input->witness_utxo->script_len;
            is_witness = true;
        } else if (input->utxo && utxo_index < input->utxo->num_outputs) {
            struct wally_tx_output *out = &input->utxo->outputs[utxo_index];
            out_script = out->script;
            out_script_len = out->script_len;
        }
        if (input->redeem_script) {
            out_script = input->redeem_script;
            out_script_len = input->redeem_script_len;
            is_p2sh = true;
        }
        if (input->witness_script) {
            out_script = input->witness_script;
            out_script_len = input->witness_script_len;
            is_witness = true;
        }

        if (!out_script)
            continue; /* We need an outscript to do anything */

        if (wally_scriptpubkey_get_type(out_script, out_script_len, &type) != WALLY_OK)
            continue; /* Can't identify the type, skip */

        switch(type) {
        case WALLY_SCRIPT_TYPE_P2PKH:
            if (!finalize_p2pkh(input))
                continue;
            break;
        case WALLY_SCRIPT_TYPE_P2WPKH:
            if (!finalize_p2wpkh(input))
                continue;
            break;
        case WALLY_SCRIPT_TYPE_MULTISIG:
            if (!finalize_multisig(input, out_script, out_script_len, is_witness, is_p2sh))
                continue;
            break;
        default:
            continue; /* Can't finalize this input, skip */
        }

        /* Clear non-final things */
        clear_and_free(input->redeem_script, input->redeem_script_len);
        input->redeem_script_len = 0;
        input->redeem_script = NULL;
        clear_and_free(input->witness_script, input->witness_script_len);
        input->witness_script_len = 0;
        input->witness_script = NULL;
        wally_map_clear(&input->keypaths);
        wally_map_clear(&input->signatures);
        input->sighash = 0;
    }
    return WALLY_OK;
}